

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacPtrAbc.c
# Opt level: O3

Vec_Ptr_t * Bac_NtkTransformToPtrInputs(Bac_Ntk_t *p)

{
  Vec_Ptr_t *pVVar1;
  void **ppvVar2;
  char *pcVar3;
  long lVar4;
  long lVar5;
  int iVar6;
  ulong uVar7;
  
  iVar6 = (p->vInputs).nSize;
  uVar7 = (ulong)iVar6;
  if ((long)uVar7 < 0) {
    __assert_fail("nCap >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                  ,99,"Vec_Ptr_t *Vec_PtrAllocExact(int)");
  }
  pVVar1 = (Vec_Ptr_t *)malloc(0x10);
  pVVar1->nSize = 0;
  pVVar1->nCap = iVar6;
  if (iVar6 == 0) {
    pVVar1->pArray = (void **)0x0;
    lVar5 = 0;
    iVar6 = 0;
  }
  else {
    ppvVar2 = (void **)malloc(uVar7 << 3);
    pVVar1->pArray = ppvVar2;
    lVar4 = 0;
    do {
      pcVar3 = Bac_ObjNameStr(p,(p->vInputs).pArray[lVar4]);
      iVar6 = (int)uVar7;
      if ((int)lVar4 == iVar6) {
        if (iVar6 < 0x10) {
          if (pVVar1->pArray == (void **)0x0) {
            ppvVar2 = (void **)malloc(0x80);
          }
          else {
            ppvVar2 = (void **)realloc(pVVar1->pArray,0x80);
          }
          pVVar1->pArray = ppvVar2;
          pVVar1->nCap = 0x10;
          uVar7 = 0x10;
        }
        else {
          uVar7 = (ulong)(uint)(iVar6 * 2);
          if (pVVar1->pArray == (void **)0x0) {
            ppvVar2 = (void **)malloc(uVar7 * 8);
          }
          else {
            ppvVar2 = (void **)realloc(pVVar1->pArray,uVar7 * 8);
          }
          pVVar1->pArray = ppvVar2;
          pVVar1->nCap = iVar6 * 2;
        }
      }
      else {
        ppvVar2 = pVVar1->pArray;
      }
      iVar6 = (int)uVar7;
      lVar5 = lVar4 + 1;
      pVVar1->nSize = (int)lVar5;
      ppvVar2[lVar4] = pcVar3;
      lVar4 = lVar5;
    } while (lVar5 < (p->vInputs).nSize);
  }
  if ((int)lVar5 != iVar6) {
    __assert_fail("Vec_PtrSize(vArray) == Vec_PtrCap(vArray)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/bac/bacPtrAbc.c"
                  ,0x6b,"int Ptr_CheckArray(Vec_Ptr_t *)");
  }
  return pVVar1;
}

Assistant:

Vec_Ptr_t * Bac_NtkTransformToPtrInputs( Bac_Ntk_t * p )
{
    int i, iTerm;
    Vec_Ptr_t * vSigs = Vec_PtrAllocExact( Bac_NtkPiNum(p) );
    Bac_NtkForEachPi( p, iTerm, i )
        Vec_PtrPush( vSigs, Bac_ObjNameStr(p, iTerm) );
    assert( Ptr_CheckArray(vSigs) );
    return vSigs;
}